

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_redor(BtorSimBitVector *bv)

{
  uint32_t *puVar1;
  BtorSimBitVector *pBVar2;
  ulong uVar3;
  
  pBVar2 = btorsim_bv_new(1);
  uVar3 = 0;
  do {
    if (bv->len == uVar3) {
      (&pBVar2[1].width)[pBVar2->len - 1] = (&pBVar2[1].width)[pBVar2->len - 1] & 0xfffffffe;
      return pBVar2;
    }
    puVar1 = &bv[1].width + uVar3;
    uVar3 = uVar3 + 1;
  } while (*puVar1 == 0);
  (&pBVar2[1].width)[pBVar2->len - 1] = (&pBVar2[1].width)[pBVar2->len - 1] | 1;
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redor (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));
  bit = 0;
  for (i = 0; !bit && i < bv->len; i++)
    if (bv->bits[i]) bit = 1;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}